

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_util.cc
# Opt level: O2

void raptor_sockaddr_make_wildcard4(int port,raptor_resolved_address *resolved_wild_out)

{
  raptor_sockaddr_in *wild_out;
  
  if ((uint)port < 0x10000) {
    resolved_wild_out->addr[0x70] = '\0';
    resolved_wild_out->addr[0x71] = '\0';
    resolved_wild_out->addr[0x72] = '\0';
    resolved_wild_out->addr[0x73] = '\0';
    resolved_wild_out->addr[0x74] = '\0';
    resolved_wild_out->addr[0x75] = '\0';
    resolved_wild_out->addr[0x76] = '\0';
    resolved_wild_out->addr[0x77] = '\0';
    resolved_wild_out->addr[0x78] = '\0';
    resolved_wild_out->addr[0x79] = '\0';
    resolved_wild_out->addr[0x7a] = '\0';
    resolved_wild_out->addr[0x7b] = '\0';
    resolved_wild_out->addr[0x7c] = '\0';
    resolved_wild_out->addr[0x7d] = '\0';
    resolved_wild_out->addr[0x7e] = '\0';
    resolved_wild_out->addr[0x7f] = '\0';
    resolved_wild_out->addr[100] = '\0';
    resolved_wild_out->addr[0x65] = '\0';
    resolved_wild_out->addr[0x66] = '\0';
    resolved_wild_out->addr[0x67] = '\0';
    resolved_wild_out->addr[0x68] = '\0';
    resolved_wild_out->addr[0x69] = '\0';
    resolved_wild_out->addr[0x6a] = '\0';
    resolved_wild_out->addr[0x6b] = '\0';
    resolved_wild_out->addr[0x6c] = '\0';
    resolved_wild_out->addr[0x6d] = '\0';
    resolved_wild_out->addr[0x6e] = '\0';
    resolved_wild_out->addr[0x6f] = '\0';
    resolved_wild_out->addr[0x70] = '\0';
    resolved_wild_out->addr[0x71] = '\0';
    resolved_wild_out->addr[0x72] = '\0';
    resolved_wild_out->addr[0x73] = '\0';
    resolved_wild_out->addr[0x54] = '\0';
    resolved_wild_out->addr[0x55] = '\0';
    resolved_wild_out->addr[0x56] = '\0';
    resolved_wild_out->addr[0x57] = '\0';
    resolved_wild_out->addr[0x58] = '\0';
    resolved_wild_out->addr[0x59] = '\0';
    resolved_wild_out->addr[0x5a] = '\0';
    resolved_wild_out->addr[0x5b] = '\0';
    resolved_wild_out->addr[0x5c] = '\0';
    resolved_wild_out->addr[0x5d] = '\0';
    resolved_wild_out->addr[0x5e] = '\0';
    resolved_wild_out->addr[0x5f] = '\0';
    resolved_wild_out->addr[0x60] = '\0';
    resolved_wild_out->addr[0x61] = '\0';
    resolved_wild_out->addr[0x62] = '\0';
    resolved_wild_out->addr[99] = '\0';
    resolved_wild_out->addr[0x44] = '\0';
    resolved_wild_out->addr[0x45] = '\0';
    resolved_wild_out->addr[0x46] = '\0';
    resolved_wild_out->addr[0x47] = '\0';
    resolved_wild_out->addr[0x48] = '\0';
    resolved_wild_out->addr[0x49] = '\0';
    resolved_wild_out->addr[0x4a] = '\0';
    resolved_wild_out->addr[0x4b] = '\0';
    resolved_wild_out->addr[0x4c] = '\0';
    resolved_wild_out->addr[0x4d] = '\0';
    resolved_wild_out->addr[0x4e] = '\0';
    resolved_wild_out->addr[0x4f] = '\0';
    resolved_wild_out->addr[0x50] = '\0';
    resolved_wild_out->addr[0x51] = '\0';
    resolved_wild_out->addr[0x52] = '\0';
    resolved_wild_out->addr[0x53] = '\0';
    resolved_wild_out->addr[0x34] = '\0';
    resolved_wild_out->addr[0x35] = '\0';
    resolved_wild_out->addr[0x36] = '\0';
    resolved_wild_out->addr[0x37] = '\0';
    resolved_wild_out->addr[0x38] = '\0';
    resolved_wild_out->addr[0x39] = '\0';
    resolved_wild_out->addr[0x3a] = '\0';
    resolved_wild_out->addr[0x3b] = '\0';
    resolved_wild_out->addr[0x3c] = '\0';
    resolved_wild_out->addr[0x3d] = '\0';
    resolved_wild_out->addr[0x3e] = '\0';
    resolved_wild_out->addr[0x3f] = '\0';
    resolved_wild_out->addr[0x40] = '\0';
    resolved_wild_out->addr[0x41] = '\0';
    resolved_wild_out->addr[0x42] = '\0';
    resolved_wild_out->addr[0x43] = '\0';
    resolved_wild_out->addr[0x24] = '\0';
    resolved_wild_out->addr[0x25] = '\0';
    resolved_wild_out->addr[0x26] = '\0';
    resolved_wild_out->addr[0x27] = '\0';
    resolved_wild_out->addr[0x28] = '\0';
    resolved_wild_out->addr[0x29] = '\0';
    resolved_wild_out->addr[0x2a] = '\0';
    resolved_wild_out->addr[0x2b] = '\0';
    resolved_wild_out->addr[0x2c] = '\0';
    resolved_wild_out->addr[0x2d] = '\0';
    resolved_wild_out->addr[0x2e] = '\0';
    resolved_wild_out->addr[0x2f] = '\0';
    resolved_wild_out->addr[0x30] = '\0';
    resolved_wild_out->addr[0x31] = '\0';
    resolved_wild_out->addr[0x32] = '\0';
    resolved_wild_out->addr[0x33] = '\0';
    resolved_wild_out->addr[0x14] = '\0';
    resolved_wild_out->addr[0x15] = '\0';
    resolved_wild_out->addr[0x16] = '\0';
    resolved_wild_out->addr[0x17] = '\0';
    resolved_wild_out->addr[0x18] = '\0';
    resolved_wild_out->addr[0x19] = '\0';
    resolved_wild_out->addr[0x1a] = '\0';
    resolved_wild_out->addr[0x1b] = '\0';
    resolved_wild_out->addr[0x1c] = '\0';
    resolved_wild_out->addr[0x1d] = '\0';
    resolved_wild_out->addr[0x1e] = '\0';
    resolved_wild_out->addr[0x1f] = '\0';
    resolved_wild_out->addr[0x20] = '\0';
    resolved_wild_out->addr[0x21] = '\0';
    resolved_wild_out->addr[0x22] = '\0';
    resolved_wild_out->addr[0x23] = '\0';
    resolved_wild_out->addr[4] = '\0';
    resolved_wild_out->addr[5] = '\0';
    resolved_wild_out->addr[6] = '\0';
    resolved_wild_out->addr[7] = '\0';
    resolved_wild_out->addr[8] = '\0';
    resolved_wild_out->addr[9] = '\0';
    resolved_wild_out->addr[10] = '\0';
    resolved_wild_out->addr[0xb] = '\0';
    resolved_wild_out->addr[0xc] = '\0';
    resolved_wild_out->addr[0xd] = '\0';
    resolved_wild_out->addr[0xe] = '\0';
    resolved_wild_out->addr[0xf] = '\0';
    resolved_wild_out->addr[0x10] = '\0';
    resolved_wild_out->addr[0x11] = '\0';
    resolved_wild_out->addr[0x12] = '\0';
    resolved_wild_out->addr[0x13] = '\0';
    resolved_wild_out->addr[0] = '\x02';
    resolved_wild_out->addr[1] = '\0';
    *(ushort *)(resolved_wild_out->addr + 2) = (ushort)port << 8 | (ushort)port >> 8;
    resolved_wild_out->len = 0x10;
    return;
  }
  raptor::LogFormatPrint
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/socket_util.cc"
             ,0x8c,kLogLevelError,"assertion failed: %s","port >= 0 && port < 65536");
  abort();
}

Assistant:

void raptor_sockaddr_make_wildcard4(int port,
                                    raptor_resolved_address* resolved_wild_out) {
    raptor_sockaddr_in* wild_out =
        reinterpret_cast<raptor_sockaddr_in*>(resolved_wild_out->addr);
    RAPTOR_ASSERT(port >= 0 && port < 65536);
    memset(resolved_wild_out, 0, sizeof(*resolved_wild_out));
    wild_out->sin_family = AF_INET;
    wild_out->sin_port = htons(static_cast<uint16_t>(port));
    resolved_wild_out->len = static_cast<socklen_t>(sizeof(raptor_sockaddr_in));
}